

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

void * ply_grow_array(p_ply ply,void **pointer,long *nmemb,long size)

{
  long lVar1;
  long lVar2;
  long count;
  void *temp;
  long size_local;
  long *nmemb_local;
  void **pointer_local;
  p_ply ply_local;
  
  lVar1 = *nmemb;
  lVar2 = lVar1 + 1;
  if (*pointer == (void *)0x0) {
    count = (long)malloc(lVar2 * size);
  }
  else {
    count = (long)realloc(*pointer,lVar2 * size);
  }
  if (count == 0) {
    ply_ferror(ply,"Out of memory");
    ply_local = (p_ply)0x0;
  }
  else {
    *pointer = (void *)count;
    *nmemb = lVar2;
    ply_local = (p_ply)(count + lVar1 * size);
  }
  return ply_local;
}

Assistant:

static void *ply_grow_array(p_ply ply, void **pointer,
        long *nmemb, long size) {
    void *temp = *pointer;
    long count = *nmemb + 1;
    if (!temp) temp = malloc(count*size);
    else temp = realloc(temp, count*size);
    if (!temp) {
        ply_ferror(ply, "Out of memory");
        return NULL;
    }
    *pointer = temp;
    *nmemb = count;
    return (char *) temp + (count-1) * size;
}